

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outer_join_marker.cpp
# Opt level: O2

void __thiscall
duckdb::OuterJoinMarker::SetMatches
          (OuterJoinMarker *this,SelectionVector *sel,idx_t count,idx_t base_idx)

{
  sel_t *psVar1;
  _Head_base<0UL,_bool_*,_false> _Var2;
  idx_t iVar3;
  idx_t iVar4;
  
  if (this->enabled == true) {
    psVar1 = sel->sel_vector;
    _Var2._M_head_impl =
         (this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
         super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
         super__Head_base<0UL,_bool_*,_false>._M_head_impl;
    for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
      iVar4 = iVar3;
      if (psVar1 != (sel_t *)0x0) {
        iVar4 = (idx_t)psVar1[iVar3];
      }
      _Var2._M_head_impl[iVar4 + base_idx] = true;
    }
  }
  return;
}

Assistant:

void OuterJoinMarker::SetMatches(const SelectionVector &sel, idx_t count, idx_t base_idx) {
	if (!enabled) {
		return;
	}
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto pos = base_idx + idx;
		D_ASSERT(pos < this->count);
		found_match[pos] = true;
	}
}